

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

int mz_zip_reader_locate_file(mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  bool bVar6;
  int local_d0;
  int local_c8;
  int local_c4;
  int local_bc;
  ulong local_b8;
  int local_ac;
  int ofs;
  char *pFile_comment;
  mz_uint file_comment_len;
  mz_uint file_extra_len;
  char *pFilename;
  mz_uint filename_len;
  mz_uint8 *pHeader;
  size_t comment_len;
  size_t name_len;
  mz_uint file_index;
  mz_uint flags_local;
  char *pComment_local;
  char *pName_local;
  mz_zip_archive *pZip_local;
  mz_uint i_1;
  uint local_2c;
  mz_uint i;
  
  if ((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
      (pName == (char *)0x0)) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    pZip_local._0_4_ = -1;
  }
  else if ((((flags & 0x300) == 0) && (pComment == (char *)0x0)) &&
          ((pZip->m_pState->m_sorted_central_dir_offsets).m_size != 0)) {
    pZip_local._0_4_ = mz_zip_reader_locate_file_binary_search(pZip,pName);
  }
  else {
    sVar4 = strlen(pName);
    if (sVar4 < 0x10000) {
      if (pComment == (char *)0x0) {
        local_b8 = 0;
      }
      else {
        local_b8 = strlen(pComment);
      }
      if (local_b8 < 0x10000) {
        for (name_len._0_4_ = 0; (uint)name_len < pZip->m_total_files;
            name_len._0_4_ = (uint)name_len + 1) {
          pvVar5 = (pZip->m_pState->m_central_dir).m_p;
          uVar1 = *(uint *)((long)(pZip->m_pState->m_central_dir_offsets).m_p +
                           (ulong)(uint)name_len * 4);
          pFilename._4_4_ = (uint)*(ushort *)((long)pvVar5 + (ulong)uVar1 + 0x1c);
          _file_comment_len = (void *)((long)pvVar5 + (ulong)uVar1 + 0x2e);
          if (sVar4 <= pFilename._4_4_) {
            if (local_b8 == 0) {
LAB_0018f7ae:
              if (((flags & 0x200) != 0) && (pFilename._4_4_ != 0)) {
                local_ac = pFilename._4_4_ - 1;
                do {
                  if (((*(char *)((long)_file_comment_len + (long)local_ac) == '/') ||
                      (*(char *)((long)_file_comment_len + (long)local_ac) == '\\')) ||
                     (*(char *)((long)_file_comment_len + (long)local_ac) == ':')) break;
                  local_ac = local_ac + -1;
                } while (-1 < local_ac);
                _file_comment_len = (void *)((long)_file_comment_len + (long)(local_ac + 1));
                pFilename._4_4_ = pFilename._4_4_ - (local_ac + 1);
              }
              if (pFilename._4_4_ == sVar4) {
                if ((flags & 0x100) == 0) {
                  for (pZip_local._4_4_ = 0; pZip_local._4_4_ < pFilename._4_4_;
                      pZip_local._4_4_ = pZip_local._4_4_ + 1) {
                    if ((pName[pZip_local._4_4_] < 'A') || ('Z' < pName[pZip_local._4_4_])) {
                      local_c8 = (int)pName[pZip_local._4_4_];
                    }
                    else {
                      local_c8 = pName[pZip_local._4_4_] + 0x20;
                    }
                    if ((*(char *)((long)_file_comment_len + (ulong)pZip_local._4_4_) < 'A') ||
                       ('Z' < *(char *)((long)_file_comment_len + (ulong)pZip_local._4_4_))) {
                      local_d0 = (int)*(char *)((long)_file_comment_len + (ulong)pZip_local._4_4_);
                    }
                    else {
                      local_d0 = *(char *)((long)_file_comment_len + (ulong)pZip_local._4_4_) + 0x20
                      ;
                    }
                    if (local_c8 != local_d0) {
                      bVar6 = false;
                      goto LAB_0018f9bd;
                    }
                  }
                  bVar6 = true;
                }
                else {
                  iVar3 = memcmp(pName,_file_comment_len,(ulong)pFilename._4_4_);
                  bVar6 = iVar3 == 0;
                }
LAB_0018f9bd:
                if (bVar6) {
                  return (uint)name_len;
                }
              }
            }
            else {
              uVar2 = (uint)*(ushort *)((long)pvVar5 + (ulong)uVar1 + 0x20);
              pvVar5 = (void *)((long)_file_comment_len +
                               (ulong)*(ushort *)((long)pvVar5 + (ulong)uVar1 + 0x1e) +
                               (ulong)pFilename._4_4_);
              if (uVar2 == local_b8) {
                if ((flags & 0x100) == 0) {
                  for (local_2c = 0; local_2c < uVar2; local_2c = local_2c + 1) {
                    if ((pComment[local_2c] < 'A') || ('Z' < pComment[local_2c])) {
                      local_bc = (int)pComment[local_2c];
                    }
                    else {
                      local_bc = pComment[local_2c] + 0x20;
                    }
                    if ((*(char *)((long)pvVar5 + (ulong)local_2c) < 'A') ||
                       ('Z' < *(char *)((long)pvVar5 + (ulong)local_2c))) {
                      local_c4 = (int)*(char *)((long)pvVar5 + (ulong)local_2c);
                    }
                    else {
                      local_c4 = *(char *)((long)pvVar5 + (ulong)local_2c) + 0x20;
                    }
                    if (local_bc != local_c4) {
                      bVar6 = false;
                      goto LAB_0018f7a1;
                    }
                  }
                  bVar6 = true;
                }
                else {
                  iVar3 = memcmp(pComment,pvVar5,(ulong)uVar2);
                  bVar6 = iVar3 == 0;
                }
LAB_0018f7a1:
                if (bVar6) goto LAB_0018f7ae;
              }
            }
          }
        }
        pZip_local._0_4_ = -1;
      }
      else {
        pZip_local._0_4_ = -1;
      }
    }
    else {
      pZip_local._0_4_ = -1;
    }
  }
  return (int)pZip_local;
}

Assistant:

int mz_zip_reader_locate_file(mz_zip_archive *pZip, const char *pName, const char *pComment, mz_uint flags)
{
  mz_uint file_index; size_t name_len, comment_len;
  if ((!pZip) || (!pZip->m_pState) || (!pName) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING))
    return -1;
  if (((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) && (!pComment) && (pZip->m_pState->m_sorted_central_dir_offsets.m_size))
    return mz_zip_reader_locate_file_binary_search(pZip, pName);
  name_len = strlen(pName); if (name_len > 0xFFFF) return -1;
  comment_len = pComment ? strlen(pComment) : 0; if (comment_len > 0xFFFF) return -1;
  for (file_index = 0; file_index < pZip->m_total_files; file_index++)
  {
    const mz_uint8 *pHeader = &MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir, mz_uint8, MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index));
    mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    const char *pFilename = (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
    if (filename_len < name_len)
      continue;
    if (comment_len)
    {
      mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS), file_comment_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
      const char *pFile_comment = pFilename + filename_len + file_extra_len;
      if ((file_comment_len != comment_len) || (!mz_zip_reader_string_equal(pComment, pFile_comment, file_comment_len, flags)))
        continue;
    }
    if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len))
    {
      int ofs = filename_len - 1;
      do
      {
        if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') || (pFilename[ofs] == ':'))
          break;
      } while (--ofs >= 0);
      ofs++;
      pFilename += ofs; filename_len -= ofs;
    }
    if ((filename_len == name_len) && (mz_zip_reader_string_equal(pName, pFilename, filename_len, flags)))
      return file_index;
  }
  return -1;
}